

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

Type __thiscall capnp::Schema::BrandArgumentList::operator[](BrandArgumentList *this,uint index)

{
  Binding *pBVar1;
  ulong uVar2;
  ulong uVar3;
  anon_union_8_2_eba6ea51_for_Type_5 aVar4;
  ulong uVar5;
  ulong uVar6;
  Type TVar7;
  
  if (this->isUnbound == true) {
    aVar4 = (anon_union_8_2_eba6ea51_for_Type_5)this->scopeId;
    uVar5 = (ulong)index;
    uVar2 = 0x12;
    uVar3 = 0;
    uVar6 = 0;
    goto LAB_00190f9e;
  }
  if (this->size_ <= index) {
    uVar2 = 0x12;
    uVar3 = 0;
    uVar6 = 0;
    uVar5 = 0;
    aVar4.schema = (RawBrandedSchema *)0x0;
    goto LAB_00190f9e;
  }
  pBVar1 = this->bindings + index;
  uVar2 = (ulong)this->bindings[index].which;
  if (uVar2 == 0x12) {
    aVar4 = (anon_union_8_2_eba6ea51_for_Type_5)(pBVar1->field_4).schema;
    if (aVar4.schema == (RawBrandedSchema *)0x0) {
      uVar2 = (ulong)pBVar1->paramIndex << 0x20;
      if (pBVar1->isImplicitParameter == true) {
        uVar2 = uVar2 | 0x1000012;
      }
      else {
        uVar2 = uVar2 | 0x12;
      }
LAB_00190f78:
      aVar4.schema = (RawBrandedSchema *)0x0;
    }
    else {
      uVar2 = (ulong)pBVar1->paramIndex << 0x20 | 0x12;
    }
  }
  else {
    if ((pBVar1->field_4).schema == (RawBrandedSchema *)0x0) goto LAB_00190f78;
    _::RawBrandedSchema::ensureInitialized((pBVar1->field_4).schema);
    uVar2 = (ulong)pBVar1->which;
    aVar4 = (anon_union_8_2_eba6ea51_for_Type_5)(pBVar1->field_4).schema;
  }
  uVar5 = uVar2 >> 0x20;
  uVar6 = (ulong)((uint)uVar2 & 0xff000000);
  uVar3 = (ulong)((uint)pBVar1->listDepth * 0x10000 + (uint)uVar2 & 0xff0000);
  uVar2 = uVar2 & 0xffff;
LAB_00190f9e:
  TVar7._0_8_ = (uVar5 & 0xffff) << 0x20 | uVar2 | uVar3 | uVar6;
  TVar7.field_4.schema = aVar4.schema;
  return TVar7;
}

Assistant:

Type Schema::BrandArgumentList::operator[](uint index) const {
  if (isUnbound) {
    return Type::BrandParameter { scopeId, index };
  }

  if (index >= size_) {
    // Binding index out-of-range. Treat as AnyPointer. This is important to allow new
    // type parameters to be added to existing types without breaking dependent
    // schemas.
    return schema::Type::ANY_POINTER;
  }

  auto& binding = bindings[index];
  Type result;
  if (binding.which == (uint)schema::Type::ANY_POINTER) {
    if (binding.scopeId != 0) {
      result = Type::BrandParameter { binding.scopeId, binding.paramIndex };
    } else if (binding.isImplicitParameter) {
      result = Type::ImplicitParameter { binding.paramIndex };
    } else {
      result = static_cast<schema::Type::AnyPointer::Unconstrained::Which>(binding.paramIndex);
    }
  } else if (binding.schema == nullptr) {
    // Builtin / primitive type.
    result = static_cast<schema::Type::Which>(binding.which);
  } else {
    binding.schema->ensureInitialized();
    result = Type(static_cast<schema::Type::Which>(binding.which), binding.schema);
  }

  return result.wrapInList(binding.listDepth);
}